

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_rw_hook_validate(fio_rw_hook_s *rw_hooks)

{
  if (rw_hooks->read == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
    rw_hooks->read = fio_hooks_default_read;
  }
  if (rw_hooks->write == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
    rw_hooks->write = fio_hooks_default_write;
  }
  if (rw_hooks->flush == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
    rw_hooks->flush = fio_hooks_default_flush;
  }
  if (rw_hooks->before_close == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
    rw_hooks->before_close = fio_hooks_default_before_close;
  }
  if (rw_hooks->cleanup != (_func_void_void_ptr *)0x0) {
    return;
  }
  rw_hooks->cleanup = fio_hooks_default_cleanup;
  return;
}

Assistant:

static inline void fio_rw_hook_validate(fio_rw_hook_s *rw_hooks) {
  if (!rw_hooks->read)
    rw_hooks->read = fio_hooks_default_read;
  if (!rw_hooks->write)
    rw_hooks->write = fio_hooks_default_write;
  if (!rw_hooks->flush)
    rw_hooks->flush = fio_hooks_default_flush;
  if (!rw_hooks->before_close)
    rw_hooks->before_close = fio_hooks_default_before_close;
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup = fio_hooks_default_cleanup;
}